

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O3

void __thiscall Satyricon::SATSolver::reduce_learned(SATSolver *this)

{
  double dVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  ClausePtr pCVar4;
  long lVar5;
  pointer ppCVar6;
  uint uVar7;
  ulong uVar8;
  __normal_iterator<Satyricon::Clause_**,_std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>_>
  __i;
  ulong uVar9;
  size_type __new_size;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  ppCVar2 = (this->learned).
            super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (this->learned).
            super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar9 = (long)ppCVar3 - (long)ppCVar2 >> 3;
  dVar1 = (this->param).clause_activity_update;
  if (ppCVar3 != ppCVar2) {
    lVar5 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
              (ppCVar2,ppCVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppCVar3 - (long)ppCVar2 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
                (ppCVar2,ppCVar3);
    }
    else {
      ppCVar6 = ppCVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
                (ppCVar2,ppCVar6);
      for (; ppCVar6 != ppCVar3; ppCVar6 = ppCVar6 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,__gnu_cxx::__ops::_Val_comp_iter<Satyricon::SATSolver::reduce_learned()::__0>>
                  (ppCVar6);
      }
    }
  }
  ppCVar6 = (this->learned).
            super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = (long)(this->learned).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6;
  if (uVar8 < 9) {
    uVar8 = uVar8 >> 3;
    __new_size = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    __new_size = 0;
    do {
      pCVar4 = ppCVar6[uVar10];
      if ((((ulong)*pCVar4 & 0xfffffffe) == 4) ||
         ((this->antecedents).
          super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
          super__Vector_impl_data._M_start[*(uint *)(pCVar4 + 1) >> 1] == pCVar4)) {
        ppCVar6[__new_size] = pCVar4;
        __new_size = __new_size + 1;
      }
      else {
        remove_clause(this,pCVar4);
      }
      uVar10 = uVar10 + 1;
      ppCVar6 = (this->learned).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->learned).
                    super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3;
    } while (uVar10 < uVar8 >> 1);
  }
  if (uVar10 < uVar8) {
    auVar11._8_4_ = (int)((long)ppCVar3 - (long)ppCVar2 >> 0x23);
    auVar11._0_8_ = uVar9;
    auVar11._12_4_ = 0x45300000;
    do {
      pCVar4 = ppCVar6[uVar10];
      uVar7 = *(uint *)pCVar4 >> 1;
      if ((uVar7 == 2) ||
         ((this->antecedents).
          super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>._M_impl.
          super__Vector_impl_data._M_start[*(uint *)(pCVar4 + 1) >> 1] == pCVar4)) {
LAB_00112c3c:
        ppCVar6[__new_size] = pCVar4;
        __new_size = __new_size + 1;
      }
      else {
        if ((*(uint *)pCVar4 & 1) == 0) {
          __assert_fail("is_learned()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                        ,0x7f,"double &Satyricon::Clause::get_activity()");
        }
        if (dVar1 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) <=
            *(double *)(&pCVar4[1].field_0x0 + (ulong)uVar7 * 4)) goto LAB_00112c3c;
        remove_clause(this,pCVar4);
      }
      uVar10 = uVar10 + 1;
      ppCVar6 = (this->learned).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->learned).
                                    super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3)
            );
  }
  std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::resize
            (&this->learned,__new_size);
  return;
}

Assistant:

void SATSolver::reduce_learned() {
    size_t i = 0, j = 0; // use this indices to compact the vector
    // Remove any clause below this activity
    double  extra_lim = param.clause_activity_update / learned.size();

    // sort learned clause by activity (in ascending order)
    sort(learned.begin(), learned.end(),
            [&](const ClausePtr& l, const ClausePtr& r)
                { return l->get_activity() < r->get_activity(); });

    // remove the first half
    for ( ; i < learned.size()/2 ; ++i ) {
        // keep a clause if is the antecedent of an asignment
        if ( learned[i]->size() == 2 || 
                antecedents[learned[i]->at(0).var()] == learned[i] )
            learned[j++] = learned[i]; // keep the justification
        else
            remove_clause(learned[i]);
    }

    // move the second half in the first half (this effectively delete the
    // low activity clauses)
    for (; i < learned.size(); ++i) {
        // keep a clause if is the antecedent of an asignment
        if ( learned[i]->size() == 2 || 
                antecedents[learned[i]->at(0).var()] == learned[i] ||
                learned[i]->get_activity() >= extra_lim )
            learned[j++] = learned[i]; // keep the justification
        else
            remove_clause(learned[i]);
    }

    // keep only the most active clause
    learned.resize( j );
}